

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall GlobOpt::TryTailDup(GlobOpt *this,BranchInstr *tailBranch)

{
  IRKind IVar1;
  OpCode OVar2;
  Type TVar3;
  BasicBlock *this_00;
  LabelInstr *pLVar4;
  Type this_01;
  Func *block;
  byte bVar5;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint functionId;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  LabelInstr *oldLabelInstr;
  SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *pSVar10;
  undefined4 *puVar11;
  Type *ppBVar12;
  Instr *instr;
  char *message;
  char *error;
  byte bVar13;
  LabelInstr *pLVar14;
  BranchInstr *pBVar15;
  undefined1 local_88 [8];
  EditingIterator iter;
  Type local_34;
  
  this_02 = JITTimeWorkItem::GetJITFunctionBody
                      (((tailBranch->super_Instr).m_func)->topFunc->m_workItem);
  uVar9 = JITTimeFunctionBody::GetSourceContextId(this_02);
  this_03 = JITTimeWorkItem::GetJITTimeInfo(((tailBranch->super_Instr).m_func)->topFunc->m_workItem)
  ;
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,TailDupPhase,uVar9,functionId);
  if (!bVar7) {
    OVar2 = (tailBranch->super_Instr).m_opcode;
    if (OVar2 < ADD) {
      bVar7 = OVar2 == MultiBr || OVar2 == Br;
    }
    else {
      bVar7 = LowererMD::IsUnconditionalBranch(&tailBranch->super_Instr);
    }
    if (bVar7 != false) {
      bVar13 = 1;
      oldLabelInstr = (LabelInstr *)tailBranch;
      do {
        oldLabelInstr =
             (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(&oldLabelInstr->super_Instr);
        IVar1 = (oldLabelInstr->super_Instr).m_kind;
        if (((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) ||
           (((oldLabelInstr->super_Instr).field_0x38 & 0x10) != 0)) break;
        bVar7 = OpCodeAttr::CanCSE((oldLabelInstr->super_Instr).m_opcode);
        bVar5 = bVar13 & bVar7;
        bVar13 = 0;
      } while (bVar5 != 0);
      IVar1 = (oldLabelInstr->super_Instr).m_kind;
      bVar7 = (IVar1 - 3 & 0xfffffffd) == 0;
      pLVar14 = oldLabelInstr;
      if ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel)) {
        return bVar7;
      }
      do {
        pLVar14 = (LabelInstr *)(pLVar14->super_Instr).m_prev;
        IVar1 = (pLVar14->super_Instr).m_kind;
        if ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel)) break;
      } while ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
               (pLVar14->labelRefs).
               super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar14->labelRefs);
      this_00 = oldLabelInstr->m_block;
      TVar3 = (this_00->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
              super_RealCount.count;
      pSVar10 = &oldLabelInstr->labelRefs;
      iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
      local_88 = (undefined1  [8])pSVar10;
      iter.super_EditingIterator.super_Iterator.list =
           (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)pSVar10;
      bVar8 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_88);
      local_34 = 0;
      if (bVar8) {
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        local_34 = 0;
        iter.super_EditingIterator.last = (NodeBase *)this;
        do {
          ppBVar12 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)local_88);
          OVar2 = ((*ppBVar12)->super_Instr).m_opcode;
          if (OVar2 < ADD) {
            bVar8 = OVar2 == MultiBr || OVar2 == Br;
          }
          else {
            bVar8 = LowererMD::IsUnconditionalBranch(&(*ppBVar12)->super_Instr);
          }
          if (bVar8 != false) {
            pLVar4 = (*ppBVar12)->m_branchTarget;
            bVar8 = (*ppBVar12)->m_isMultiBranch;
            if (pLVar4 == (LabelInstr *)0x0) {
              if (bVar8 == false) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar11 = 1;
                uVar9 = 0x20e;
                error = "(m_isMultiBranch)";
                message = "m_isMultiBranch";
                goto LAB_004433a5;
              }
            }
            else if (bVar8 != false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              uVar9 = 0x209;
              error = "(!m_isMultiBranch)";
              message = "!m_isMultiBranch";
LAB_004433a5:
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,uVar9,error,message);
              if (!bVar8) goto LAB_00443537;
              *puVar11 = 0;
            }
            if ((pLVar4 != (LabelInstr *)0x0) &&
               ((LabelInstr *)*ppBVar12 != (LabelInstr *)tailBranch &&
                (LabelInstr *)*ppBVar12 != pLVar14)) {
              for (pBVar15 = (BranchInstr *)(oldLabelInstr->super_Instr).m_next;
                  pBVar15 != tailBranch; pBVar15 = (BranchInstr *)(pBVar15->super_Instr).m_next) {
                this_01 = *ppBVar12;
                instr = IR::Instr::Copy(&pBVar15->super_Instr,true);
                IR::Instr::InsertBefore(&this_01->super_Instr,instr);
              }
              pBVar15 = *ppBVar12;
              IR::BranchInstr::ReplaceTarget(pBVar15,oldLabelInstr,tailBranch->m_branchTarget);
              this = (GlobOpt *)iter.super_EditingIterator.last;
              for (; (IVar1 = (pBVar15->super_Instr).m_kind, IVar1 != InstrKindLabel &&
                     (IVar1 != InstrKindProfiledLabel));
                  pBVar15 = (BranchInstr *)(pBVar15->super_Instr).m_prev) {
              }
              block = pBVar15[1].super_Instr.m_func;
              BasicBlock::RemovePred
                        (this_00,(BasicBlock *)block,
                         (FlowGraph *)iter.super_EditingIterator.last[0x15].next[0x42].next);
              FlowGraph::AddEdge((FlowGraph *)((NodeBase *)((long)this + 0xa8))->next[0x42].next,
                                 (BasicBlock *)block,tailBranch->m_branchTarget->m_block);
              local_34 = local_34 + 1;
            }
          }
          bVar8 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
                  Next((EditingIterator *)local_88);
        } while (bVar8);
      }
      if (local_34 != TVar3) {
        return bVar7;
      }
      if ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
          (pSVar10->super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x342,"(mergeLabel->labelRefs.Empty())",
                           "Should not remove block with referenced label.");
        if (!bVar8) {
LAB_00443537:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar11 = 0;
      }
      FlowGraph::RemoveBlock(this->func->m_fg,this_00,(GlobOpt *)0x0,true);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::TryTailDup(IR::BranchInstr *tailBranch)
{
    if (PHASE_OFF(Js::TailDupPhase, tailBranch->m_func->GetTopFunc()))
    {
        return false;
    }

    if (tailBranch->IsConditional())
    {
        return false;
    }

    IR::Instr *instr;
    uint instrCount = 0;
    for (instr = tailBranch->GetPrevRealInstrOrLabel(); !instr->IsLabelInstr(); instr = instr->GetPrevRealInstrOrLabel())
    {
        if (instr->HasBailOutInfo())
        {
            break;
        }
        if (!OpCodeAttr::CanCSE(instr->m_opcode))
        {
            // Consider: We could be more aggressive here
            break;
        }

        instrCount++;

        if (instrCount > 1)
        {
            // Consider: If copy handled single-def tmps renaming, we could do more instrs
            break;
        }
    }

    if (!instr->IsLabelInstr())
    {
        return false;
    }

    IR::LabelInstr *mergeLabel = instr->AsLabelInstr();
    IR::Instr *mergeLabelPrev = mergeLabel->m_prev;

    // Skip unreferenced labels
    while (mergeLabelPrev->IsLabelInstr() && mergeLabelPrev->AsLabelInstr()->labelRefs.Empty())
    {
        mergeLabelPrev = mergeLabelPrev->m_prev;
    }

    BasicBlock* labelBlock = mergeLabel->GetBasicBlock();
    uint origPredCount = labelBlock->GetPredList()->Count();
    uint dupCount = 0;

    // We are good to go. Let's do the tail duplication.
    FOREACH_SLISTCOUNTED_ENTRY_EDITING(IR::BranchInstr*, branchEntry, &mergeLabel->labelRefs, iter)
    {
        if (branchEntry->IsUnconditional() && !branchEntry->IsMultiBranch() && branchEntry != mergeLabelPrev && branchEntry != tailBranch)
        {
            for (instr = mergeLabel->m_next; instr != tailBranch; instr = instr->m_next)
            {
                branchEntry->InsertBefore(instr->Copy());
            }

            instr = branchEntry;
            branchEntry->ReplaceTarget(mergeLabel, tailBranch->GetTarget());

            while(!instr->IsLabelInstr())
            {
                instr = instr->m_prev;
            }
            BasicBlock* branchBlock = instr->AsLabelInstr()->GetBasicBlock();

            labelBlock->RemovePred(branchBlock, func->m_fg);
            func->m_fg->AddEdge(branchBlock, tailBranch->GetTarget()->GetBasicBlock());

            dupCount++;
        }
    } NEXT_SLISTCOUNTED_ENTRY_EDITING;

    // If we've duplicated everywhere, tail block is dead and should be removed.
    if (dupCount == origPredCount)
    {
        AssertMsg(mergeLabel->labelRefs.Empty(), "Should not remove block with referenced label.");
        func->m_fg->RemoveBlock(labelBlock, nullptr, true);
    }

    return true;
}